

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learn.cpp
# Opt level: O3

void readfile(char *data_file)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  iterator iVar8;
  vector<double,_std::allocator<double>_> *pvVar9;
  long lVar10;
  char buff [200000];
  vector<double,_std::allocator<double>_> vStack_30da8;
  int iStack_30d8c;
  FILE *pFStack_30d88;
  void *pvStack_30d80;
  char acStack_30d78 [200008];
  
  pFStack_30d88 = fopen(data_file,"r");
  if (0 < data_n) {
    iVar7 = 0;
    do {
      vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
      ::emplace_back<std::vector<double,std::allocator<double>>>
                ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                  *)&data_x,&vStack_30da8);
      if (vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
      ::emplace_back<std::vector<double,std::allocator<double>>>
                ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                  *)&data_y,&vStack_30da8);
      if (vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < data_n);
  }
  iVar7 = data_n;
  uVar4 = 0xffffffffffffffff;
  if (-1 < data_n) {
    uVar4 = (long)data_n * 4;
  }
  pvVar2 = operator_new__(uVar4);
  if (0 < iVar7) {
    lVar10 = 0;
    iVar7 = 200000;
    pvStack_30d80 = pvVar2;
    do {
      pvVar2 = pvStack_30d80;
      fgets(acStack_30d78,200000,pFStack_30d88);
      pcVar3 = strtok(acStack_30d78,", \r\n");
      iVar1 = atoi(pcVar3);
      *(int *)((long)pvVar2 + lVar10 * 4) = iVar1;
      iStack_30d8c = iVar7;
      if (iVar1 < iVar7) {
        iStack_30d8c = iVar1;
      }
      pcVar3 = strtok((char *)0x0,", \r\n");
      if (0 < ts_len) {
        iVar7 = 0;
        do {
          pvVar9 = data_x.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar10;
          vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)atof(pcVar3);
          iVar8._M_current =
               (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar8._M_current ==
              (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (pvVar9,iVar8,(double *)&vStack_30da8);
          }
          else {
            *iVar8._M_current =
                 (double)vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
            (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar8._M_current + 1;
          }
          pcVar3 = strtok((char *)0x0,", \r\n");
          iVar7 = iVar7 + 1;
        } while (iVar7 < ts_len);
      }
      iVar1 = data_n;
      lVar10 = lVar10 + 1;
      uVar4 = (ulong)data_n;
      iVar7 = iStack_30d8c;
    } while (lVar10 < (long)uVar4);
    pvVar2 = pvStack_30d80;
    if (0 < data_n) {
      uVar6 = 0;
      iVar7 = 0;
      do {
        iVar5 = *(int *)((long)pvStack_30d80 + uVar6 * 4) - iStack_30d8c;
        *(int *)((long)pvStack_30d80 + uVar6 * 4) = iVar5;
        if (iVar5 < iVar7) {
          iVar5 = iVar7;
        }
        iVar7 = iVar5;
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
      iVar7 = iVar7 + 1;
      num_c = iVar7;
      if (0 < iVar1) {
        lVar10 = 0;
        do {
          if (0 < iVar7) {
            iVar7 = *(int *)((long)pvVar2 + lVar10 * 4);
            iVar1 = 0;
            do {
              pvVar9 = data_y.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar10;
              if (iVar7 == iVar1) {
                vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
                iVar8._M_current =
                     (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar8._M_current ==
                    (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) goto LAB_00101a51;
                *iVar8._M_current = 1.0;
LAB_00101a47:
                (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish = iVar8._M_current + 1;
              }
              else {
                vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                iVar8._M_current =
                     (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar8._M_current !=
                    (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  *iVar8._M_current = 0.0;
                  goto LAB_00101a47;
                }
LAB_00101a51:
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          (pvVar9,iVar8,(double *)&vStack_30da8);
              }
              iVar1 = iVar1 + 1;
            } while (iVar1 < num_c);
            uVar4 = (ulong)(uint)data_n;
            pvVar2 = pvStack_30d80;
            iVar7 = num_c;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < (int)uVar4);
      }
      goto LAB_00101a97;
    }
  }
  num_c = 1;
LAB_00101a97:
  operator_delete__(pvVar2);
  fclose(pFStack_30d88);
  return;
}

Assistant:

void readfile(char *data_file) {
    FILE *f;
    f = fopen(data_file, "r");

    char buff[MAX_CHAR_PER_LINE];
    char *tmp;

    for (int i = 0; i < data_n; ++i) {
        data_x.push_back(vector<double>());
        data_y.push_back(vector<double>());
    }

    int *label = new int[data_n];
    int min_c = MAX_CHAR_PER_LINE;

    for (int i = 0; i < data_n; i++) {
        fgets(buff, MAX_CHAR_PER_LINE, f);
        tmp = strtok(buff, ", \r\n");

        label[i] = atoi(tmp);
        min_c = min(min_c, label[i]);

        tmp = strtok(NULL, ", \r\n");
        for (int j = 0; j < ts_len; ++j) {
            data_x[i].push_back(atof(tmp));
            tmp = strtok(NULL, ", \r\n");
        }
    }

    num_c = 0;
    for (int i = 0; i < data_n; ++i) {
        label[i] -= min_c;
        num_c = max(num_c, label[i]);
    }
    ++num_c;

    /**
     * label(xi) = a => y = {0 .... 1 .... 0}
     *                              ^
     *                              a position
     */
    for (int i = 0; i < data_n; ++i) {
        for (int j = 0; j < num_c; ++j) {
            if (j == label[i]) {
                data_y[i].push_back(1.0);
            } else {
                data_y[i].push_back(0.0);
            }
        }
    }

    delete[] label;

    fclose(f);
}